

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Group.h
# Opt level: O3

void __thiscall FIX::Group::Group(Group *this,int field,int delim)

{
  int *piVar1;
  atomic<long> *counter;
  message_order local_40;
  
  FIX::message_order::message_order(&local_40,delim,0);
  FIX::FieldMap::FieldMap(&this->super_FieldMap,&local_40);
  piVar1 = local_40.m_groupOrder.m_buffer;
  if ((long *)local_40.m_groupOrder.m_buffer != (long *)0x0) {
    LOCK();
    *(long *)local_40.m_groupOrder.m_buffer = *(long *)local_40.m_groupOrder.m_buffer + -1;
    UNLOCK();
    if (*(long *)local_40.m_groupOrder.m_buffer == 0) {
      local_40.m_groupOrder.m_size = 0;
      local_40.m_groupOrder.m_buffer = (int *)0x0;
      if ((long *)piVar1 != (long *)0x0) {
        operator_delete__(piVar1);
      }
    }
  }
  *(undefined ***)this = &PTR__FieldMap_003251e8;
  this->m_field = field;
  this->m_delim = delim;
  return;
}

Assistant:

Group(int field, int delim)
      : FieldMap(message_order(delim, 0)),
        m_field(field),
        m_delim(delim) {}